

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *this,Numeral *numeral,PolyNf *term
          )

{
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> SStack_a8;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  local_88;
  RationalConstantType local_78;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> local_58;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_28;
  
  RationalConstantType::RationalConstantType(&local_78,&numeral->super_RationalConstantType);
  Lib::CoproductImpl::TrivialOperations::CopyCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  ::DefaultImpl(&local_28,
                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                 *)term);
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)&SStack_a8,
             (PolyNf *)&local_28);
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)&local_88,
             (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)&SStack_a8);
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
            (&local_58,(Numeral *)&local_78,&local_88);
  Polynom(this,&local_58);
  RationalConstantType::~RationalConstantType((RationalConstantType *)&local_58);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&SStack_a8)
  ;
  RationalConstantType::~RationalConstantType(&local_78);
  return;
}

Assistant:

Polynom<Number>::Polynom(Numeral numeral, PolyNf term) 
  : Polynom(Monom(numeral, perfect(MonomFactors(term))))
{  }